

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

quicly_stream_t * quicly_get_stream(quicly_conn_t *conn,quicly_stream_id_t stream_id)

{
  khint_t kVar1;
  kh_quicly_stream_t_t *pkVar2;
  quicly_stream_t *pqVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  pkVar2 = conn->streams;
  kVar1 = pkVar2->n_buckets;
  if (kVar1 == 0) {
    uVar6 = 0;
LAB_0011c029:
    if (uVar6 == kVar1) {
      pqVar3 = (quicly_stream_t *)0x0;
    }
    else {
      pqVar3 = pkVar2->vals[uVar6];
    }
  }
  else {
    uVar7 = ((uint)((ulong)stream_id >> 0x21) ^ (uint)stream_id << 0xb ^ (uint)stream_id) &
            kVar1 - 1;
    iVar5 = 1;
    pqVar3 = (quicly_stream_t *)0x0;
    uVar6 = uVar7;
    do {
      bVar4 = (char)uVar6 * '\x02' & 0x1e;
      uVar8 = pkVar2->flags[uVar6 >> 4] >> bVar4;
      if (((uVar8 & 2) != 0) || (((uVar8 & 1) == 0 && (pkVar2->keys[uVar6] == stream_id)))) {
        if ((pkVar2->flags[uVar6 >> 4] >> bVar4 & 3) != 0) {
          uVar6 = kVar1;
        }
        goto LAB_0011c029;
      }
      uVar6 = uVar6 + iVar5 & kVar1 - 1;
      iVar5 = iVar5 + 1;
    } while (uVar6 != uVar7);
  }
  return pqVar3;
}

Assistant:

quicly_stream_t *quicly_get_stream(quicly_conn_t *conn, quicly_stream_id_t stream_id)
{
    khiter_t iter = kh_get(quicly_stream_t, conn->streams, stream_id);
    if (iter != kh_end(conn->streams))
        return kh_val(conn->streams, iter);
    return NULL;
}